

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,duckdb::hugeint_t>
          (TryCast *this,string_t input,hugeint_t *result,bool strict)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  uint64_t *puVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  long lVar14;
  IntegerCastData<short> local_c2;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  uint64_t *local_a0;
  HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> local_98;
  undefined8 local_40;
  long local_38;
  
  puVar6 = input.value._8_8_;
  local_38 = input.value._0_8_;
  if ((uint)this == 0) {
    return false;
  }
  bVar3 = (byte)result;
  uVar11 = (ulong)this & 0xffffffff;
  lVar14 = input.value._0_8_;
  if ((uint)this < 0xd) {
    lVar14 = (long)&local_40 + 4;
  }
  uVar12 = 0;
  while ((bVar2 = *(byte *)(lVar14 + uVar12), bVar2 - 9 < 5 || (bVar2 == 0x20))) {
    uVar12 = uVar12 + 1;
    if (uVar11 == uVar12) {
      return false;
    }
  }
  local_98.decimal_intermediate.upper = 0;
  local_98.decimal_intermediate_digits = 0;
  local_98._74_6_ = 0;
  local_98.decimal_total_digits = 0;
  local_98._50_6_ = 0;
  local_98.decimal_intermediate.lower = 0;
  local_98.decimal.lower = 0;
  local_98.decimal.upper = 0;
  local_98.intermediate = 0;
  local_98.digits = '\0';
  local_98._25_7_ = 0;
  local_98.result.lower = 0;
  local_98.result.upper = 0;
  local_c0 = uVar11 - uVar12;
  local_40 = this;
  if (bVar2 == 0x2d) {
    if (uVar11 - 1 == uVar12) {
      HugeIntegerCastOperation::
      Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>(&local_98);
      return false;
    }
    uVar9 = 1;
    local_a0 = puVar6;
    do {
      bVar2 = *(byte *)(uVar12 + uVar9 + lVar14);
      if (9 < (byte)(bVar2 - 0x30)) {
        uVar7 = uVar9;
        if (bVar2 != 0x2e) goto LAB_00283b14;
        if (bVar3 != 0) {
          return false;
        }
        uVar7 = uVar9 + 1;
        uVar10 = uVar7;
        local_b8 = uVar7;
        if (uVar7 < local_c0) goto LAB_002839a1;
        goto LAB_00283bf5;
      }
      bVar4 = HugeIntegerCastOperation::
              HandleDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
                        (&local_98,bVar2 - 0x30);
      if (!bVar4) {
        return false;
      }
      uVar10 = local_c0;
      if (~uVar9 + uVar11 == uVar12) break;
      if (*(char *)(uVar12 + 1 + uVar9 + lVar14) == '_' && bVar3 == 0) {
        if ((uVar11 - uVar9) - 2 == uVar12) {
          return false;
        }
        uVar10 = uVar9 + 2;
        if (9 < (byte)(*(char *)(uVar12 + lVar14 + uVar10) - 0x30U)) {
          return false;
        }
      }
      else {
        uVar10 = uVar9 + 1;
      }
      uVar9 = uVar10;
    } while (uVar10 < local_c0);
    goto LAB_00283b60;
  }
  if ((uVar11 - 1 != uVar12) && (bVar2 == 0x30)) {
    bVar2 = *(byte *)(lVar14 + 1 + uVar12);
    if (bVar2 < 0x62) {
      if ((bVar2 != 0x42) && (bVar2 != 0x58)) {
LAB_00283a23:
        if (((byte)(bVar2 - 0x30) < 10 & bVar3) != 0) {
          return false;
        }
        uVar9 = 0;
        goto LAB_00283829;
      }
    }
    else if ((bVar2 != 0x62) && (bVar2 != 0x78)) goto LAB_00283a23;
    if ((uVar11 - uVar12) - 3 < 0xfffffffffffffffe) {
      return false;
    }
LAB_00283959:
    HugeIntegerCastOperation::
    Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>(&local_98);
    return false;
  }
  if ((bVar2 == 0x2b & bVar3) != 0) {
    return false;
  }
  uVar9 = (ulong)(bVar2 == 0x2b);
LAB_00283829:
  local_b0 = uVar9;
  local_a0 = puVar6;
  if (local_c0 <= uVar9) goto LAB_00283959;
  do {
    bVar2 = *(byte *)(uVar12 + uVar9 + lVar14);
    if (9 < (byte)(bVar2 - 0x30)) {
      uVar7 = uVar9;
      if (bVar2 != 0x2e) goto LAB_00283c33;
      if (bVar3 != 0) {
        return false;
      }
      uVar7 = uVar9 + 1;
      local_a8 = uVar7;
      if (uVar7 < local_c0) goto LAB_00283a70;
      goto LAB_00283d1e;
    }
    bVar4 = HugeIntegerCastOperation::
            HandleDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                      (&local_98,bVar2 - 0x30);
    if (!bVar4) {
      return false;
    }
    uVar7 = local_c0;
    if (~uVar9 + uVar11 == uVar12) break;
    if (*(char *)(uVar12 + 1 + uVar9 + lVar14) == '_' && bVar3 == 0) {
      if ((uVar11 - uVar9) - 2 == uVar12) {
        return false;
      }
      uVar7 = uVar9 + 2;
      if (9 < (byte)(*(char *)(uVar12 + lVar14 + uVar7) - 0x30U)) {
        return false;
      }
    }
    else {
      uVar7 = uVar9 + 1;
    }
    uVar9 = uVar7;
  } while (uVar7 < local_c0);
  goto LAB_00283c7f;
LAB_002839a1:
  bVar2 = *(byte *)(uVar12 + uVar7 + lVar14);
  if (9 < (byte)(bVar2 - 0x30)) {
    if (uVar7 <= local_b8 && uVar9 < 2) {
      return false;
    }
LAB_00283b14:
    uVar5 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar5 - 9) {
        return false;
      }
LAB_00283b2a:
      uVar7 = uVar7 + 1;
      uVar10 = uVar7;
      if (uVar7 < local_c0) {
        do {
          bVar3 = *(byte *)(uVar12 + lVar14 + uVar7);
          if ((4 < bVar3 - 9) && (bVar3 != 0x20)) {
            return false;
          }
          uVar7 = uVar7 + 1;
          uVar10 = local_c0;
        } while (local_c0 != uVar7);
      }
      goto LAB_00283b60;
    }
    if ((bVar2 != 0x65) && (uVar5 != 0x45)) {
      if (uVar5 != 0x20) {
        return false;
      }
      goto LAB_00283b2a;
    }
    if (uVar7 == 1 || bVar3 != 0) {
      return false;
    }
    if (local_c0 <= uVar7 + 1) {
      return false;
    }
    local_c2.result = 0;
    pcVar8 = (char *)(uVar12 + lVar14 + uVar7 + 1);
    iVar13 = ~uVar12 + (uVar11 - uVar7);
    if (*pcVar8 == '-') {
      bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar8,iVar13,&local_c2,false);
    }
    else {
      bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar8,iVar13,&local_c2,false);
    }
    if (bVar4 == false) {
      return false;
    }
    bVar4 = HugeIntegerCastOperation::
            HandleExponent<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
                      (&local_98,(int)local_c2.result);
    goto LAB_00283d8e;
  }
  local_b0 = uVar7 + lVar14;
  bVar4 = HugeIntegerCastOperation::
          HandleDecimal<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true,true>
                    (&local_98,bVar2 - 0x30);
  if (!bVar4) {
    return false;
  }
  uVar10 = local_c0;
  if (~uVar7 + uVar11 != uVar12) goto code_r0x002839dd;
  goto LAB_00283bf5;
code_r0x002839dd:
  if (*(char *)(uVar12 + 1 + local_b0) == '_') {
    if ((uVar11 - uVar7) - 2 == uVar12) {
      return false;
    }
    uVar7 = uVar7 + 2;
    if (9 < (byte)(*(char *)(uVar12 + lVar14 + uVar7) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar7 = uVar7 + 1;
  }
  uVar10 = uVar7;
  if (local_c0 <= uVar7) goto LAB_00283bf5;
  goto LAB_002839a1;
LAB_00283bf5:
  if ((uVar9 < 2) && (uVar10 <= local_b8)) {
    return false;
  }
LAB_00283b60:
  bVar4 = HugeIntegerCastOperation::
          Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>(&local_98);
  if (!bVar4) {
    return false;
  }
  if (uVar10 < 2) {
    return false;
  }
  goto LAB_00283ca0;
LAB_00283a70:
  lVar1 = uVar7 + lVar14;
  bVar2 = *(byte *)(uVar12 + lVar1);
  local_b8 = uVar7;
  if (9 < (byte)(bVar2 - 0x30)) {
    if (uVar7 <= local_a8 && uVar9 <= local_b0) {
      return false;
    }
LAB_00283c33:
    uVar5 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar5 - 9) {
        return false;
      }
    }
    else {
      if ((bVar2 == 0x65) || (uVar5 == 0x45)) {
        if (uVar7 == local_b0 || bVar3 != 0) {
          return false;
        }
        if (local_c0 <= uVar7 + 1) {
          return false;
        }
        local_c2.result = 0;
        pcVar8 = (char *)(uVar12 + lVar14 + uVar7 + 1);
        iVar13 = ~uVar12 + (uVar11 - uVar7);
        if (*pcVar8 == '-') {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar8,iVar13,&local_c2,false);
        }
        else {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar8,iVar13,&local_c2,false);
        }
        if (bVar4 == false) {
          return false;
        }
        bVar4 = HugeIntegerCastOperation::
                HandleExponent<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                          (&local_98,(int)local_c2.result);
LAB_00283d8e:
        if (bVar4 == false) {
          return false;
        }
        goto LAB_00283ca0;
      }
      if (uVar5 != 0x20) {
        return false;
      }
    }
    uVar11 = uVar7 + 1;
    uVar7 = uVar11;
    if (uVar11 < local_c0) {
      do {
        bVar3 = *(byte *)(uVar12 + lVar14 + uVar11);
        if ((4 < bVar3 - 9) && (bVar3 != 0x20)) {
          return false;
        }
        uVar11 = uVar11 + 1;
        uVar7 = local_c0;
      } while (local_c0 != uVar11);
    }
    goto LAB_00283c7f;
  }
  bVar4 = HugeIntegerCastOperation::
          HandleDecimal<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false,true>
                    (&local_98,bVar2 - 0x30);
  if (!bVar4) {
    return false;
  }
  uVar7 = local_c0;
  if (~local_b8 + uVar11 != uVar12) goto code_r0x00283ab5;
  goto LAB_00283d1e;
code_r0x00283ab5:
  if (*(char *)(uVar12 + 1 + lVar1) == '_') {
    if ((uVar11 - local_b8) - 2 == uVar12) {
      return false;
    }
    uVar7 = local_b8 + 2;
    if (9 < (byte)(*(char *)(uVar12 + lVar14 + uVar7) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar7 = local_b8 + 1;
  }
  if (local_c0 <= uVar7) goto LAB_00283d1e;
  goto LAB_00283a70;
LAB_00283d1e:
  if ((uVar9 <= local_b0) && (uVar7 <= local_a8)) {
    return false;
  }
LAB_00283c7f:
  bVar4 = HugeIntegerCastOperation::
          Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>(&local_98)
  ;
  if (!bVar4) {
    return false;
  }
  if (uVar7 <= local_b0) {
    return false;
  }
LAB_00283ca0:
  *local_a0 = local_98.result.lower;
  local_a0[1] = local_98.result.upper;
  return true;
}

Assistant:

bool TryCast::Operation(string_t input, hugeint_t &result, bool strict) {
	HugeIntCastData<hugeint_t, Hugeint, int64_t> state {};
	if (!TryIntegerCast<HugeIntCastData<hugeint_t, Hugeint, int64_t>, true, true, HugeIntegerCastOperation>(
	        input.GetData(), input.GetSize(), state, strict)) {
		return false;
	}
	result = state.result;
	return true;
}